

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.h
# Opt level: O3

void __thiscall
cali::Preprocessor::operator()
          (Preprocessor *this,CaliperMetadataAccessInterface *db,EntryList *rec,
          SnapshotProcessFn *push)

{
  undefined8 uVar1;
  vector<cali::Entry,_std::allocator<cali::Entry>_> local_28;
  
  cali::Preprocessor::process((CaliperMetadataAccessInterface *)&local_28,(vector *)this);
  if ((push->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*push->_M_invoker)((_Any_data *)push,db,&local_28);
    if (local_28.super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_28.super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  uVar1 = std::__throw_bad_function_call();
  if (local_28.super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar1);
}

Assistant:

void operator() (CaliperMetadataAccessInterface& db, const EntryList& rec, SnapshotProcessFn push)
    {
        push(db, process(db, rec));
    }